

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::CommandReporter::report(CommandReporter *this,string *received,string *approved)

{
  CommandLauncher *pCVar1;
  bool bVar2;
  undefined1 uVar3;
  string sStack_48;
  int iVar4;
  
  bVar2 = exists(&this->cmd);
  if (bVar2) {
    FileUtils::ensureFileExists(approved);
    pCVar1 = this->l;
    assembleFullCommand(&sStack_48,this,received,approved);
    iVar4 = (*pCVar1->_vptr_CommandLauncher[2])(pCVar1,&sStack_48);
    uVar3 = (undefined1)iVar4;
    ::std::__cxx11::string::~string((string *)&sStack_48);
  }
  else {
    uVar3 = 0;
  }
  return (bool)uVar3;
}

Assistant:

bool CommandReporter::report(std::string received, std::string approved) const
    {
        if (!exists(cmd))
        {
            return false;
        }
        FileUtils::ensureFileExists(approved);
        return l->launch(assembleFullCommand(received, approved));
    }